

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KeyValue.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::KeyValue::create
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,KeyValue *this,Path *path,Parameters *parameters)

{
  Client *client;
  Parameters *parameters_00;
  anon_class_1_0_00000001 local_69;
  JsonProducer local_68;
  Url local_48;
  Parameters *local_28;
  Parameters *parameters_local;
  Path *path_local;
  KeyValue *this_local;
  
  client = this->client_;
  local_28 = parameters;
  parameters_local = (Parameters *)path;
  path_local = (Path *)this;
  this_local = (KeyValue *)__return_storage_ptr__;
  getUrl(&local_48,this,path);
  parameters_00 = local_28;
  std::
  function<std::__cxx11::string(std::unordered_map<std::__cxx11::string,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>>>const&)>
  ::
  function<Vault::KeyValue::create(Vault::Tiny<Vault::PathDetail,std::__cxx11::string>const&,std::unordered_map<std::__cxx11::string,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>>>const&)::__0,void>
            ((function<std::__cxx11::string(std::unordered_map<std::__cxx11::string,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::variant<std::__cxx11::string,int,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::unordered_map<std::__cxx11::string,std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>>>>>const&)>
              *)&local_68,&local_69);
  HttpConsumer::post(__return_storage_ptr__,client,&local_48,parameters_00,&local_68);
  std::function<$dedf0043$>::~function(&local_68);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_48);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::KeyValue::create(const Vault::Path &path, const Parameters &parameters) {
  return Vault::HttpConsumer::post(
      client_, getUrl(path), parameters, [&](const Parameters &params) {
        nlohmann::json json;
        json["data"] = helpers::create_json(params);
        return json.dump();
      });
}